

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

uint64_t folder_uncompressed_size(_7z_folder *f)

{
  uint64_t uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t in_RAX;
  ulong uVar4;
  uint uVar5;
  uint64_t *puVar6;
  bool bVar7;
  
  uVar2 = (uint)f->numBindPairs;
  uVar4 = (ulong)(uint)f->numOutStreams;
  do {
    if ((int)uVar4 < 1) {
      return 0;
    }
    uVar1 = uVar4 - 1;
    bVar7 = uVar2 != 0;
    if (uVar2 == 0) {
LAB_001652c5:
      in_RAX = f->unPackSize[uVar4 - 1];
    }
    else {
      if (f->bindPairs->outIndex != uVar1) {
        uVar5 = 0;
        puVar6 = &f->bindPairs[1].outIndex;
        do {
          if (uVar2 - 1 == uVar5) {
            bVar7 = false;
            goto LAB_001652c5;
          }
          uVar5 = uVar5 + 1;
          uVar3 = *puVar6;
          puVar6 = puVar6 + 2;
        } while (uVar3 != uVar1);
        bVar7 = uVar5 < uVar2;
      }
      if (!bVar7) goto LAB_001652c5;
    }
    uVar4 = uVar1;
    if (!bVar7) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

static uint64_t
folder_uncompressed_size(struct _7z_folder *f)
{
	int n = (int)f->numOutStreams;
	unsigned pairs = (unsigned)f->numBindPairs;

	while (--n >= 0) {
		unsigned i;
		for (i = 0; i < pairs; i++) {
			if (f->bindPairs[i].outIndex == (uint64_t)n)
				break;
		}
		if (i >= pairs)
			return (f->unPackSize[n]);
	}
	return (0);
}